

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int renameTableSelectCb(Walker *pWalker,Select *pSelect)

{
  RenameCtx *pCtx;
  SrcList *pSVar1;
  Table **ppTVar2;
  long lVar3;
  
  pCtx = (pWalker->u).pRename;
  pSVar1 = pSelect->pSrc;
  ppTVar2 = &pSVar1->a[0].pTab;
  for (lVar3 = 0; lVar3 < pSVar1->nSrc; lVar3 = lVar3 + 1) {
    if (*ppTVar2 == pCtx->pTab) {
      renameTokenFind(pWalker->pParse,pCtx,ppTVar2[-2]);
    }
    ppTVar2 = ppTVar2 + 0xe;
  }
  return 0;
}

Assistant:

static int renameTableSelectCb(Walker *pWalker, Select *pSelect){
  int i;
  RenameCtx *p = pWalker->u.pRename;
  SrcList *pSrc = pSelect->pSrc;
  for(i=0; i<pSrc->nSrc; i++){
    struct SrcList_item *pItem = &pSrc->a[i];
    if( pItem->pTab==p->pTab ){
      renameTokenFind(pWalker->pParse, p, pItem->zName);
    }
  }

  return WRC_Continue;
}